

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkRwtSetSS(ARKodeMem ark_mem,N_Vector My,N_Vector weight)

{
  realtype rVar1;
  
  N_VAbs(My,ark_mem->tempv1);
  N_VScale(ark_mem->reltol,ark_mem->tempv1,ark_mem->tempv1);
  N_VAddConst(ark_mem->tempv1,ark_mem->SRabstol,ark_mem->tempv1);
  if ((ark_mem->Ratolmin0 != 0) && (rVar1 = N_VMin(ark_mem->tempv1), rVar1 <= 0.0)) {
    return -1;
  }
  N_VInv(ark_mem->tempv1,weight);
  return 0;
}

Assistant:

int arkRwtSetSS(ARKodeMem ark_mem, N_Vector My, N_Vector weight)
{
  N_VAbs(My, ark_mem->tempv1);
  N_VScale(ark_mem->reltol, ark_mem->tempv1, ark_mem->tempv1);
  N_VAddConst(ark_mem->tempv1, ark_mem->SRabstol, ark_mem->tempv1);
  if (ark_mem->Ratolmin0) {
    if (N_VMin(ark_mem->tempv1) <= ZERO) return(-1);
  }
  N_VInv(ark_mem->tempv1, weight);
  return(0);
}